

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,int *value,int defaultValue)

{
  Node *this_00;
  char *__nptr;
  char cVar1;
  uint uVar2;
  
  this_00 = this->node;
  uVar2 = Node::getEntry(this_00,key);
  if (((int)uVar2 < 0) || (__nptr = this_00->entry_[uVar2].value, __nptr == (char *)0x0)) {
    cVar1 = '\0';
  }
  else {
    defaultValue = atoi(__nptr);
    cVar1 = '\x01';
  }
  *value = defaultValue;
  return cVar1;
}

Assistant:

char Fl_Preferences::get( const char *key, int &value, int defaultValue ) {
  const char *v = node->get( key );
  value = v ? atoi( v ) : defaultValue;
  return ( v != 0 );
}